

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_add_core(REF_NODE ref_node,REF_GLOB global,REF_INT *node)

{
  int iVar1;
  REF_GLOB *pRVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  int local_40;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT extra;
  REF_INT chunk;
  REF_INT orig;
  REF_INT *node_local;
  REF_GLOB global_local;
  REF_NODE ref_node_local;
  
  if (global < 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x11f,
           "ref_node_add_core",3,"invalid global node");
    return 3;
  }
  if (ref_node->blank == -1) {
    iVar1 = ref_node->max;
    if ((int)((double)iVar1 * 1.5) < 5000) {
      local_40 = 5000;
    }
    else {
      local_40 = (int)((double)iVar1 * 1.5);
    }
    ref_node->max = iVar1 + local_40;
    fflush(_stdout);
    if (0 < ref_node->max) {
      pRVar2 = (REF_GLOB *)realloc(ref_node->global,(long)ref_node->max << 3);
      ref_node->global = pRVar2;
    }
    ref_private_macro_code_rss_1 = iVar1;
    if (ref_node->global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x125,
             "ref_node_add_core","realloc ref_node->global NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_node->max,
             (long)ref_node->max,8,(long)ref_node->max << 3);
      return 2;
    }
    for (; ref_private_macro_code_rss_1 < ref_node->max;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      ref_node->global[ref_private_macro_code_rss_1] =
           (long)(-2 - (ref_private_macro_code_rss_1 + 1));
    }
    ref_node->global[ref_node->max + -1] = -1;
    ref_node->blank = -2 - iVar1;
    fflush(_stdout);
    if (0 < ref_node->max) {
      pRVar2 = (REF_GLOB *)realloc(ref_node->sorted_global,(long)ref_node->max << 3);
      ref_node->sorted_global = pRVar2;
    }
    if (ref_node->sorted_global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",299,
             "ref_node_add_core","realloc ref_node->sorted_global NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_node->max,
             (long)ref_node->max,8,(long)ref_node->max << 3);
      return 2;
    }
    fflush(_stdout);
    if (0 < ref_node->max) {
      pRVar3 = (REF_INT *)realloc(ref_node->sorted_local,(long)ref_node->max << 2);
      ref_node->sorted_local = pRVar3;
    }
    if (ref_node->sorted_local == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",300,
             "ref_node_add_core","realloc ref_node->sorted_local NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_node->max,
             (long)ref_node->max,4,(long)ref_node->max << 2);
      return 2;
    }
    fflush(_stdout);
    if (0 < ref_node->max) {
      pRVar3 = (REF_INT *)realloc(ref_node->part,(long)ref_node->max << 2);
      ref_node->part = pRVar3;
    }
    if (ref_node->part == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x12e,
             "ref_node_add_core","realloc ref_node->part NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_node->max,
             (long)ref_node->max,4,(long)ref_node->max << 2);
      return 2;
    }
    fflush(_stdout);
    if (0 < ref_node->max) {
      pRVar3 = (REF_INT *)realloc(ref_node->age,(long)ref_node->max << 2);
      ref_node->age = pRVar3;
    }
    if (ref_node->age == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x12f,
             "ref_node_add_core","realloc ref_node->age NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_node->max,
             (long)ref_node->max,4,(long)ref_node->max << 2);
      return 2;
    }
    fflush(_stdout);
    if ((long)ref_node->max * 0xf != 0) {
      pRVar4 = (REF_DBL *)realloc(ref_node->real,(long)ref_node->max * 0x78);
      ref_node->real = pRVar4;
    }
    if (ref_node->real == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x134,
             "ref_node_add_core","realloc ref_node->real NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
             (ulong)(uint)(ref_node->max * 0xf),(long)ref_node->max * 0xf,8,
             (long)ref_node->max * 0x78);
      return 2;
    }
    if (0 < ref_node->naux) {
      fflush(_stdout);
      if ((long)ref_node->naux * (long)ref_node->max != 0) {
        pRVar4 = (REF_DBL *)realloc(ref_node->aux,(long)ref_node->naux * (long)ref_node->max * 8);
        ref_node->aux = pRVar4;
      }
      if (ref_node->aux == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x13a,"ref_node_add_core","realloc ref_node->aux NULL");
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
               (ulong)(uint)(ref_node->naux * ref_node->max),
               (long)ref_node->naux * (long)ref_node->max,8,
               (long)ref_node->naux * (long)ref_node->max * 8);
        return 2;
      }
    }
  }
  *node = -2 - ref_node->blank;
  ref_node->blank = (REF_INT)ref_node->global[*node];
  ref_node->global[*node] = global;
  ref_node->part[*node] = ref_node->ref_mpi->id;
  ref_node->age[*node] = 0;
  ref_node_local._4_4_ = ref_node_metric_form(ref_node,*node,1.0,0.0,0.0,1.0,0.0,1.0);
  if (ref_node_local._4_4_ == 0) {
    ref_node->n = ref_node->n + 1;
    ref_node_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x145,
           "ref_node_add_core",(ulong)ref_node_local._4_4_,"set ident");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_add_core(REF_NODE ref_node, REF_GLOB global,
                                            REF_INT *node) {
  REF_INT orig, chunk, extra;

  if (global < 0) RSS(REF_INVALID, "invalid global node");

  if (REF_EMPTY == ref_node->blank) {
    orig = ref_node_max(ref_node);
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_node->max = orig + chunk;
    ref_realloc(ref_node->global, ref_node_max(ref_node), REF_GLOB);
    for (extra = orig; extra < ref_node_max(ref_node); extra++)
      ref_node->global[extra] = index2next(extra + 1);
    ref_node->global[ref_node_max(ref_node) - 1] = REF_EMPTY;
    ref_node->blank = index2next(orig);

    ref_realloc(ref_node->sorted_global, ref_node_max(ref_node), REF_GLOB);
    ref_realloc(ref_node->sorted_local, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->part, ref_node_max(ref_node), REF_INT);
    ref_realloc(ref_node->age, ref_node_max(ref_node), REF_INT);

    ref_realloc(ref_node->real,
                ((unsigned long)REF_NODE_REAL_PER *
                 (unsigned long)ref_node_max(ref_node)),
                REF_DBL);

    if (ref_node_naux(ref_node) > 0)
      ref_realloc(ref_node->aux,
                  ((unsigned long)ref_node_naux(ref_node) *
                   (unsigned long)ref_node_max(ref_node)),
                  REF_DBL);
  }

  *node = next2index(ref_node->blank);
  ref_node->blank = (REF_INT)ref_node->global[*node];

  ref_node->global[*node] = global;
  ref_node->part[*node] =
      ref_mpi_rank(ref_node_mpi(ref_node)); /*local default*/
  ref_node->age[*node] = 0;                 /* default new born */

  RSS(ref_node_metric_form(ref_node, *node, 1, 0, 0, 1, 0, 1), "set ident");

  (ref_node->n)++;
  return REF_SUCCESS;
}